

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O1

void __thiscall
vkt::shaderexecutor::
DerivedFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
::initialize(DerivedFunc<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
             *this)

{
  deInt32 *pdVar1;
  SharedPtrStateBase *pSVar2;
  int iVar3;
  undefined4 extraout_var;
  Counter symCounter;
  ExpandContext ctx;
  vector<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_> local_b8
  ;
  vector<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_> local_a0
  ;
  Tuple4<vkt::shaderexecutor::ExprP<float>,_vkt::shaderexecutor::ExprP<float>,_vkt::shaderexecutor::ExprP<vkt::shaderexecutor::Void>,_vkt::shaderexecutor::ExprP<vkt::shaderexecutor::Void>_>
  local_88;
  undefined4 local_44;
  undefined4 *local_40;
  vector<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_> local_38
  ;
  string *name;
  
  if ((this->m_ret).super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
      m_ptr == (Expr<float> *)0x0) {
    iVar3 = (*(this->
              super_Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              ).super_FuncBase._vptr_FuncBase[10])();
    name = (string *)CONCAT44(extraout_var,iVar3);
    local_40 = &local_44;
    local_44 = 0;
    local_38.
    super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_38.
    super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_38.
    super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_88.a.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_ptr
         = (Expr<float> *)0x0;
    local_88.a.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
    m_state = (SharedPtrStateBase *)0x0;
    local_88.b.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_ptr
         = (Expr<float> *)0x0;
    local_88.b.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
    m_state = (SharedPtrStateBase *)0x0;
    local_88.c.super_ContainerExprPBase<vkt::shaderexecutor::Void>.
    super_ExprPBase<vkt::shaderexecutor::Void>.
    super_SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>.m_ptr =
         (Expr<vkt::shaderexecutor::Void> *)0x0;
    local_88.c.super_ContainerExprPBase<vkt::shaderexecutor::Void>.
    super_ExprPBase<vkt::shaderexecutor::Void>.
    super_SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>.m_state =
         (SharedPtrStateBase *)0x0;
    local_88.d.super_ContainerExprPBase<vkt::shaderexecutor::Void>.
    super_ExprPBase<vkt::shaderexecutor::Void>.
    super_SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>.m_ptr =
         (Expr<vkt::shaderexecutor::Void> *)0x0;
    local_88.d.super_ContainerExprPBase<vkt::shaderexecutor::Void>.
    super_ExprPBase<vkt::shaderexecutor::Void>.
    super_SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>.m_state =
         (SharedPtrStateBase *)0x0;
    variable<float>((shaderexecutor *)&local_a0,name);
    pSVar2 = (this->m_var0).super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_state;
    if (pSVar2 != (SharedPtrStateBase *)
                  local_a0.
                  super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      if (pSVar2 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &pSVar2->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          (this->m_var0).super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_ptr =
               (Variable<float> *)0x0;
          (*((this->m_var0).super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_state)->
            _vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &((this->m_var0).super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.
                  m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          pSVar2 = (this->m_var0).super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.
                   m_state;
          if (pSVar2 != (SharedPtrStateBase *)0x0) {
            (*pSVar2->_vptr_SharedPtrStateBase[1])();
          }
          (this->m_var0).super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_state =
               (SharedPtrStateBase *)0x0;
        }
      }
      (this->m_var0).super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_ptr =
           (Variable<float> *)
           local_a0.
           super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (this->m_var0).super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_state =
           (SharedPtrStateBase *)
           local_a0.
           super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if ((SharedPtrStateBase *)
          local_a0.
          super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
          ._M_impl.super__Vector_impl_data._M_finish != (SharedPtrStateBase *)0x0) {
        LOCK();
        *(deInt32 *)
         ((long)local_a0.
                super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                ._M_impl.super__Vector_impl_data._M_finish + 8) =
             *(deInt32 *)
              ((long)local_a0.
                     super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 8) + 1;
        UNLOCK();
        LOCK();
        pdVar1 = &((this->m_var0).super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.
                  m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + 1;
        UNLOCK();
      }
    }
    shaderexecutor::VariableP::operator_cast_to_ExprP((VariableP *)&local_b8);
    if (local_88.a.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
        m_state !=
        (SharedPtrStateBase *)
        local_b8.
        super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      if (local_88.a.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>
          .m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_88.a.super_ExprPBase<float>.
                   super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state)->strongRefCount
        ;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_88.a.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>
          .m_ptr = (Expr<float> *)0x0;
          (*(local_88.a.super_ExprPBase<float>.
             super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state)->
            _vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &(local_88.a.super_ExprPBase<float>.
                   super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if ((*pdVar1 == 0) &&
           (local_88.a.super_ExprPBase<float>.
            super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state !=
            (SharedPtrStateBase *)0x0)) {
          (*(local_88.a.super_ExprPBase<float>.
             super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state)->
            _vptr_SharedPtrStateBase[1])();
        }
      }
      local_88.a.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
      m_ptr = (Expr<float> *)
              local_b8.
              super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
              ._M_impl.super__Vector_impl_data._M_start;
      local_88.a.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
      m_state = (SharedPtrStateBase *)
                local_b8.
                super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if ((SharedPtrStateBase *)
          local_b8.
          super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
          ._M_impl.super__Vector_impl_data._M_finish != (SharedPtrStateBase *)0x0) {
        LOCK();
        *(deInt32 *)
         ((long)local_b8.
                super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                ._M_impl.super__Vector_impl_data._M_finish + 8) =
             *(deInt32 *)
              ((long)local_b8.
                     super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 8) + 1;
        UNLOCK();
        LOCK();
        *(deInt32 *)
         ((long)local_b8.
                super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                ._M_impl.super__Vector_impl_data._M_finish + 0xc) =
             *(deInt32 *)
              ((long)local_b8.
                     super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 0xc) + 1;
        UNLOCK();
      }
    }
    if ((SharedPtrStateBase *)
        local_b8.
        super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
        ._M_impl.super__Vector_impl_data._M_finish != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = (deInt32 *)
               ((long)local_b8.
                      super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                      ._M_impl.super__Vector_impl_data._M_finish + 8);
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_b8.
        super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (*(*(_func_int ***)
            &(local_b8.
              super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
              ._M_impl.super__Vector_impl_data._M_finish)->
             super_SharedPtr<const_vkt::shaderexecutor::Statement>)[2])();
      }
      LOCK();
      pdVar1 = (deInt32 *)
               ((long)local_b8.
                      super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                      ._M_impl.super__Vector_impl_data._M_finish + 0xc);
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if ((SharedPtrStateBase *)
            local_b8.
            super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
            ._M_impl.super__Vector_impl_data._M_finish != (SharedPtrStateBase *)0x0) {
          (*(*(_func_int ***)
              &(local_b8.
                super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                ._M_impl.super__Vector_impl_data._M_finish)->
               super_SharedPtr<const_vkt::shaderexecutor::Statement>)[1])();
        }
        local_b8.
        super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      }
    }
    if ((SharedPtrStateBase *)
        local_a0.
        super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
        ._M_impl.super__Vector_impl_data._M_finish != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = (deInt32 *)
               ((long)local_a0.
                      super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                      ._M_impl.super__Vector_impl_data._M_finish + 8);
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_a0.
        super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (*(*(_func_int ***)
            &(local_a0.
              super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
              ._M_impl.super__Vector_impl_data._M_finish)->
             super_SharedPtr<const_vkt::shaderexecutor::Statement>)[2])();
      }
      LOCK();
      pdVar1 = (deInt32 *)
               ((long)local_a0.
                      super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                      ._M_impl.super__Vector_impl_data._M_finish + 0xc);
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if ((SharedPtrStateBase *)
            local_a0.
            super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
            ._M_impl.super__Vector_impl_data._M_finish != (SharedPtrStateBase *)0x0) {
          (*(*(_func_int ***)
              &(local_a0.
                super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                ._M_impl.super__Vector_impl_data._M_finish)->
               super_SharedPtr<const_vkt::shaderexecutor::Statement>)[1])();
        }
        local_a0.
        super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      }
    }
    variable<float>((shaderexecutor *)&local_a0,name + 1);
    pSVar2 = (this->m_var1).super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_state;
    if (pSVar2 != (SharedPtrStateBase *)
                  local_a0.
                  super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      if (pSVar2 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &pSVar2->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          (this->m_var1).super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_ptr =
               (Variable<float> *)0x0;
          (*((this->m_var1).super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_state)->
            _vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &((this->m_var1).super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.
                  m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          pSVar2 = (this->m_var1).super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.
                   m_state;
          if (pSVar2 != (SharedPtrStateBase *)0x0) {
            (*pSVar2->_vptr_SharedPtrStateBase[1])();
          }
          (this->m_var1).super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_state =
               (SharedPtrStateBase *)0x0;
        }
      }
      (this->m_var1).super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_ptr =
           (Variable<float> *)
           local_a0.
           super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (this->m_var1).super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.m_state =
           (SharedPtrStateBase *)
           local_a0.
           super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if ((SharedPtrStateBase *)
          local_a0.
          super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
          ._M_impl.super__Vector_impl_data._M_finish != (SharedPtrStateBase *)0x0) {
        LOCK();
        *(deInt32 *)
         ((long)local_a0.
                super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                ._M_impl.super__Vector_impl_data._M_finish + 8) =
             *(deInt32 *)
              ((long)local_a0.
                     super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 8) + 1;
        UNLOCK();
        LOCK();
        pdVar1 = &((this->m_var1).super_SharedPtr<const_vkt::shaderexecutor::Variable<float>_>.
                  m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + 1;
        UNLOCK();
      }
    }
    shaderexecutor::VariableP::operator_cast_to_ExprP((VariableP *)&local_b8);
    if (local_88.b.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
        m_state !=
        (SharedPtrStateBase *)
        local_b8.
        super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      if (local_88.b.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>
          .m_state != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_88.b.super_ExprPBase<float>.
                   super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state)->strongRefCount
        ;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_88.b.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>
          .m_ptr = (Expr<float> *)0x0;
          (*(local_88.b.super_ExprPBase<float>.
             super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state)->
            _vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &(local_88.b.super_ExprPBase<float>.
                   super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if ((*pdVar1 == 0) &&
           (local_88.b.super_ExprPBase<float>.
            super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state !=
            (SharedPtrStateBase *)0x0)) {
          (*(local_88.b.super_ExprPBase<float>.
             super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state)->
            _vptr_SharedPtrStateBase[1])();
        }
      }
      local_88.b.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
      m_ptr = (Expr<float> *)
              local_b8.
              super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
              ._M_impl.super__Vector_impl_data._M_start;
      local_88.b.super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
      m_state = (SharedPtrStateBase *)
                local_b8.
                super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if ((SharedPtrStateBase *)
          local_b8.
          super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
          ._M_impl.super__Vector_impl_data._M_finish != (SharedPtrStateBase *)0x0) {
        LOCK();
        *(deInt32 *)
         ((long)local_b8.
                super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                ._M_impl.super__Vector_impl_data._M_finish + 8) =
             *(deInt32 *)
              ((long)local_b8.
                     super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 8) + 1;
        UNLOCK();
        LOCK();
        *(deInt32 *)
         ((long)local_b8.
                super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                ._M_impl.super__Vector_impl_data._M_finish + 0xc) =
             *(deInt32 *)
              ((long)local_b8.
                     super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 0xc) + 1;
        UNLOCK();
      }
    }
    if ((SharedPtrStateBase *)
        local_b8.
        super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
        ._M_impl.super__Vector_impl_data._M_finish != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = (deInt32 *)
               ((long)local_b8.
                      super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                      ._M_impl.super__Vector_impl_data._M_finish + 8);
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_b8.
        super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (*(*(_func_int ***)
            &(local_b8.
              super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
              ._M_impl.super__Vector_impl_data._M_finish)->
             super_SharedPtr<const_vkt::shaderexecutor::Statement>)[2])();
      }
      LOCK();
      pdVar1 = (deInt32 *)
               ((long)local_b8.
                      super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                      ._M_impl.super__Vector_impl_data._M_finish + 0xc);
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if ((SharedPtrStateBase *)
            local_b8.
            super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
            ._M_impl.super__Vector_impl_data._M_finish != (SharedPtrStateBase *)0x0) {
          (*(*(_func_int ***)
              &(local_b8.
                super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                ._M_impl.super__Vector_impl_data._M_finish)->
               super_SharedPtr<const_vkt::shaderexecutor::Statement>)[1])();
        }
        local_b8.
        super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      }
    }
    if ((SharedPtrStateBase *)
        local_a0.
        super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
        ._M_impl.super__Vector_impl_data._M_finish != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = (deInt32 *)
               ((long)local_a0.
                      super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                      ._M_impl.super__Vector_impl_data._M_finish + 8);
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_a0.
        super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (*(*(_func_int ***)
            &(local_a0.
              super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
              ._M_impl.super__Vector_impl_data._M_finish)->
             super_SharedPtr<const_vkt::shaderexecutor::Statement>)[2])();
      }
      LOCK();
      pdVar1 = (deInt32 *)
               ((long)local_a0.
                      super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                      ._M_impl.super__Vector_impl_data._M_finish + 0xc);
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if ((SharedPtrStateBase *)
            local_a0.
            super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
            ._M_impl.super__Vector_impl_data._M_finish != (SharedPtrStateBase *)0x0) {
          (*(*(_func_int ***)
              &(local_a0.
                super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                ._M_impl.super__Vector_impl_data._M_finish)->
               super_SharedPtr<const_vkt::shaderexecutor::Statement>)[1])();
        }
        local_a0.
        super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      }
    }
    variable<vkt::shaderexecutor::Void>((shaderexecutor *)&local_a0,name + 2);
    pSVar2 = (this->m_var2).
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
             m_state;
    if (pSVar2 != (SharedPtrStateBase *)
                  local_a0.
                  super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      if (pSVar2 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &pSVar2->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          (this->m_var2).
          super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr =
               (Variable<vkt::shaderexecutor::Void> *)0x0;
          (*((this->m_var2).
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
            m_state)->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &((this->m_var2).
                   super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                  m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          pSVar2 = (this->m_var2).
                   super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                   m_state;
          if (pSVar2 != (SharedPtrStateBase *)0x0) {
            (*pSVar2->_vptr_SharedPtrStateBase[1])();
          }
          (this->m_var2).
          super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_state =
               (SharedPtrStateBase *)0x0;
        }
      }
      (this->m_var2).
      super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr =
           (Variable<vkt::shaderexecutor::Void> *)
           local_a0.
           super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (this->m_var2).
      super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_state =
           (SharedPtrStateBase *)
           local_a0.
           super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if ((SharedPtrStateBase *)
          local_a0.
          super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
          ._M_impl.super__Vector_impl_data._M_finish != (SharedPtrStateBase *)0x0) {
        LOCK();
        *(deInt32 *)
         ((long)local_a0.
                super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                ._M_impl.super__Vector_impl_data._M_finish + 8) =
             *(deInt32 *)
              ((long)local_a0.
                     super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 8) + 1;
        UNLOCK();
        LOCK();
        pdVar1 = &((this->m_var2).
                   super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                  m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + 1;
        UNLOCK();
      }
    }
    shaderexecutor::VariableP::operator_cast_to_ExprP((VariableP *)&local_b8);
    if (local_88.c.super_ContainerExprPBase<vkt::shaderexecutor::Void>.
        super_ExprPBase<vkt::shaderexecutor::Void>.
        super_SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>.m_state !=
        (SharedPtrStateBase *)
        local_b8.
        super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      if (local_88.c.super_ContainerExprPBase<vkt::shaderexecutor::Void>.
          super_ExprPBase<vkt::shaderexecutor::Void>.
          super_SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>.m_state !=
          (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_88.c.super_ContainerExprPBase<vkt::shaderexecutor::Void>.
                   super_ExprPBase<vkt::shaderexecutor::Void>.
                   super_SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>.
                  m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_88.c.super_ContainerExprPBase<vkt::shaderexecutor::Void>.
          super_ExprPBase<vkt::shaderexecutor::Void>.
          super_SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>.m_ptr =
               (Expr<vkt::shaderexecutor::Void> *)0x0;
          (*(local_88.c.super_ContainerExprPBase<vkt::shaderexecutor::Void>.
             super_ExprPBase<vkt::shaderexecutor::Void>.
             super_SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>.m_state)->
            _vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &(local_88.c.super_ContainerExprPBase<vkt::shaderexecutor::Void>.
                   super_ExprPBase<vkt::shaderexecutor::Void>.
                   super_SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>.
                  m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if ((*pdVar1 == 0) &&
           (local_88.c.super_ContainerExprPBase<vkt::shaderexecutor::Void>.
            super_ExprPBase<vkt::shaderexecutor::Void>.
            super_SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>.m_state !=
            (SharedPtrStateBase *)0x0)) {
          (*(local_88.c.super_ContainerExprPBase<vkt::shaderexecutor::Void>.
             super_ExprPBase<vkt::shaderexecutor::Void>.
             super_SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>.m_state)->
            _vptr_SharedPtrStateBase[1])();
        }
      }
      local_88.c.super_ContainerExprPBase<vkt::shaderexecutor::Void>.
      super_ExprPBase<vkt::shaderexecutor::Void>.
      super_SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>.m_ptr =
           (Expr<vkt::shaderexecutor::Void> *)
           local_b8.
           super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_88.c.super_ContainerExprPBase<vkt::shaderexecutor::Void>.
      super_ExprPBase<vkt::shaderexecutor::Void>.
      super_SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>.m_state =
           (SharedPtrStateBase *)
           local_b8.
           super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if ((SharedPtrStateBase *)
          local_b8.
          super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
          ._M_impl.super__Vector_impl_data._M_finish != (SharedPtrStateBase *)0x0) {
        LOCK();
        *(deInt32 *)
         ((long)local_b8.
                super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                ._M_impl.super__Vector_impl_data._M_finish + 8) =
             *(deInt32 *)
              ((long)local_b8.
                     super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 8) + 1;
        UNLOCK();
        LOCK();
        *(deInt32 *)
         ((long)local_b8.
                super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                ._M_impl.super__Vector_impl_data._M_finish + 0xc) =
             *(deInt32 *)
              ((long)local_b8.
                     super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 0xc) + 1;
        UNLOCK();
      }
    }
    if ((SharedPtrStateBase *)
        local_b8.
        super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
        ._M_impl.super__Vector_impl_data._M_finish != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = (deInt32 *)
               ((long)local_b8.
                      super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                      ._M_impl.super__Vector_impl_data._M_finish + 8);
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_b8.
        super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (*(*(_func_int ***)
            &(local_b8.
              super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
              ._M_impl.super__Vector_impl_data._M_finish)->
             super_SharedPtr<const_vkt::shaderexecutor::Statement>)[2])();
      }
      LOCK();
      pdVar1 = (deInt32 *)
               ((long)local_b8.
                      super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                      ._M_impl.super__Vector_impl_data._M_finish + 0xc);
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if ((SharedPtrStateBase *)
            local_b8.
            super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
            ._M_impl.super__Vector_impl_data._M_finish != (SharedPtrStateBase *)0x0) {
          (*(*(_func_int ***)
              &(local_b8.
                super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                ._M_impl.super__Vector_impl_data._M_finish)->
               super_SharedPtr<const_vkt::shaderexecutor::Statement>)[1])();
        }
        local_b8.
        super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      }
    }
    if ((SharedPtrStateBase *)
        local_a0.
        super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
        ._M_impl.super__Vector_impl_data._M_finish != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = (deInt32 *)
               ((long)local_a0.
                      super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                      ._M_impl.super__Vector_impl_data._M_finish + 8);
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_a0.
        super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (*(*(_func_int ***)
            &(local_a0.
              super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
              ._M_impl.super__Vector_impl_data._M_finish)->
             super_SharedPtr<const_vkt::shaderexecutor::Statement>)[2])();
      }
      LOCK();
      pdVar1 = (deInt32 *)
               ((long)local_a0.
                      super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                      ._M_impl.super__Vector_impl_data._M_finish + 0xc);
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if ((SharedPtrStateBase *)
            local_a0.
            super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
            ._M_impl.super__Vector_impl_data._M_finish != (SharedPtrStateBase *)0x0) {
          (*(*(_func_int ***)
              &(local_a0.
                super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                ._M_impl.super__Vector_impl_data._M_finish)->
               super_SharedPtr<const_vkt::shaderexecutor::Statement>)[1])();
        }
        local_a0.
        super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      }
    }
    variable<vkt::shaderexecutor::Void>((shaderexecutor *)&local_a0,name + 3);
    pSVar2 = (this->m_var3).
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
             m_state;
    if (pSVar2 != (SharedPtrStateBase *)
                  local_a0.
                  super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      if (pSVar2 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &pSVar2->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          (this->m_var3).
          super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr =
               (Variable<vkt::shaderexecutor::Void> *)0x0;
          (*((this->m_var3).
             super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
            m_state)->_vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &((this->m_var3).
                   super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                  m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          pSVar2 = (this->m_var3).
                   super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                   m_state;
          if (pSVar2 != (SharedPtrStateBase *)0x0) {
            (*pSVar2->_vptr_SharedPtrStateBase[1])();
          }
          (this->m_var3).
          super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_state =
               (SharedPtrStateBase *)0x0;
        }
      }
      (this->m_var3).
      super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_ptr =
           (Variable<vkt::shaderexecutor::Void> *)
           local_a0.
           super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
           ._M_impl.super__Vector_impl_data._M_start;
      (this->m_var3).
      super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.m_state =
           (SharedPtrStateBase *)
           local_a0.
           super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if ((SharedPtrStateBase *)
          local_a0.
          super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
          ._M_impl.super__Vector_impl_data._M_finish != (SharedPtrStateBase *)0x0) {
        LOCK();
        *(deInt32 *)
         ((long)local_a0.
                super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                ._M_impl.super__Vector_impl_data._M_finish + 8) =
             *(deInt32 *)
              ((long)local_a0.
                     super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 8) + 1;
        UNLOCK();
        LOCK();
        pdVar1 = &((this->m_var3).
                   super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                  m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + 1;
        UNLOCK();
      }
    }
    shaderexecutor::VariableP::operator_cast_to_ExprP((VariableP *)&local_b8);
    if (local_88.d.super_ContainerExprPBase<vkt::shaderexecutor::Void>.
        super_ExprPBase<vkt::shaderexecutor::Void>.
        super_SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>.m_state !=
        (SharedPtrStateBase *)
        local_b8.
        super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      if (local_88.d.super_ContainerExprPBase<vkt::shaderexecutor::Void>.
          super_ExprPBase<vkt::shaderexecutor::Void>.
          super_SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>.m_state !=
          (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &(local_88.d.super_ContainerExprPBase<vkt::shaderexecutor::Void>.
                   super_ExprPBase<vkt::shaderexecutor::Void>.
                   super_SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>.
                  m_state)->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          local_88.d.super_ContainerExprPBase<vkt::shaderexecutor::Void>.
          super_ExprPBase<vkt::shaderexecutor::Void>.
          super_SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>.m_ptr =
               (Expr<vkt::shaderexecutor::Void> *)0x0;
          (*(local_88.d.super_ContainerExprPBase<vkt::shaderexecutor::Void>.
             super_ExprPBase<vkt::shaderexecutor::Void>.
             super_SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>.m_state)->
            _vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &(local_88.d.super_ContainerExprPBase<vkt::shaderexecutor::Void>.
                   super_ExprPBase<vkt::shaderexecutor::Void>.
                   super_SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>.
                  m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if ((*pdVar1 == 0) &&
           (local_88.d.super_ContainerExprPBase<vkt::shaderexecutor::Void>.
            super_ExprPBase<vkt::shaderexecutor::Void>.
            super_SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>.m_state !=
            (SharedPtrStateBase *)0x0)) {
          (*(local_88.d.super_ContainerExprPBase<vkt::shaderexecutor::Void>.
             super_ExprPBase<vkt::shaderexecutor::Void>.
             super_SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>.m_state)->
            _vptr_SharedPtrStateBase[1])();
        }
      }
      local_88.d.super_ContainerExprPBase<vkt::shaderexecutor::Void>.
      super_ExprPBase<vkt::shaderexecutor::Void>.
      super_SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>.m_ptr =
           (Expr<vkt::shaderexecutor::Void> *)
           local_b8.
           super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
           ._M_impl.super__Vector_impl_data._M_start;
      local_88.d.super_ContainerExprPBase<vkt::shaderexecutor::Void>.
      super_ExprPBase<vkt::shaderexecutor::Void>.
      super_SharedPtr<const_vkt::shaderexecutor::Expr<vkt::shaderexecutor::Void>_>.m_state =
           (SharedPtrStateBase *)
           local_b8.
           super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if ((SharedPtrStateBase *)
          local_b8.
          super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
          ._M_impl.super__Vector_impl_data._M_finish != (SharedPtrStateBase *)0x0) {
        LOCK();
        *(deInt32 *)
         ((long)local_b8.
                super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                ._M_impl.super__Vector_impl_data._M_finish + 8) =
             *(deInt32 *)
              ((long)local_b8.
                     super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 8) + 1;
        UNLOCK();
        LOCK();
        *(deInt32 *)
         ((long)local_b8.
                super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                ._M_impl.super__Vector_impl_data._M_finish + 0xc) =
             *(deInt32 *)
              ((long)local_b8.
                     super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 0xc) + 1;
        UNLOCK();
      }
    }
    if ((SharedPtrStateBase *)
        local_b8.
        super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
        ._M_impl.super__Vector_impl_data._M_finish != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = (deInt32 *)
               ((long)local_b8.
                      super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                      ._M_impl.super__Vector_impl_data._M_finish + 8);
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_b8.
        super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (*(*(_func_int ***)
            &(local_b8.
              super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
              ._M_impl.super__Vector_impl_data._M_finish)->
             super_SharedPtr<const_vkt::shaderexecutor::Statement>)[2])();
      }
      LOCK();
      pdVar1 = (deInt32 *)
               ((long)local_b8.
                      super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                      ._M_impl.super__Vector_impl_data._M_finish + 0xc);
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if ((SharedPtrStateBase *)
            local_b8.
            super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
            ._M_impl.super__Vector_impl_data._M_finish != (SharedPtrStateBase *)0x0) {
          (*(*(_func_int ***)
              &(local_b8.
                super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                ._M_impl.super__Vector_impl_data._M_finish)->
               super_SharedPtr<const_vkt::shaderexecutor::Statement>)[1])();
        }
        local_b8.
        super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      }
    }
    if ((SharedPtrStateBase *)
        local_a0.
        super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
        ._M_impl.super__Vector_impl_data._M_finish != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = (deInt32 *)
               ((long)local_a0.
                      super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                      ._M_impl.super__Vector_impl_data._M_finish + 8);
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_a0.
        super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (*(*(_func_int ***)
            &(local_a0.
              super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
              ._M_impl.super__Vector_impl_data._M_finish)->
             super_SharedPtr<const_vkt::shaderexecutor::Statement>)[2])();
      }
      LOCK();
      pdVar1 = (deInt32 *)
               ((long)local_a0.
                      super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                      ._M_impl.super__Vector_impl_data._M_finish + 0xc);
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if ((SharedPtrStateBase *)
            local_a0.
            super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
            ._M_impl.super__Vector_impl_data._M_finish != (SharedPtrStateBase *)0x0) {
          (*(*(_func_int ***)
              &(local_a0.
                super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                ._M_impl.super__Vector_impl_data._M_finish)->
               super_SharedPtr<const_vkt::shaderexecutor::Statement>)[1])();
        }
        local_a0.
        super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      }
    }
    (*(this->
      super_Func<vkt::shaderexecutor::Signature<float,_float,_float,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
      ).super_FuncBase._vptr_FuncBase[0xb])(&local_b8,this,&local_40,&local_88);
    pSVar2 = (this->m_ret).super_ExprPBase<float>.
             super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state;
    if (pSVar2 != (SharedPtrStateBase *)
                  local_b8.
                  super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      if (pSVar2 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pdVar1 = &pSVar2->strongRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          (this->m_ret).super_ExprPBase<float>.
          super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_ptr = (Expr<float> *)0x0;
          (*((this->m_ret).super_ExprPBase<float>.
             super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state)->
            _vptr_SharedPtrStateBase[2])();
        }
        LOCK();
        pdVar1 = &((this->m_ret).super_ExprPBase<float>.
                   super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + -1;
        UNLOCK();
        if (*pdVar1 == 0) {
          pSVar2 = (this->m_ret).super_ExprPBase<float>.
                   super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state;
          if (pSVar2 != (SharedPtrStateBase *)0x0) {
            (*pSVar2->_vptr_SharedPtrStateBase[1])();
          }
          (this->m_ret).super_ExprPBase<float>.
          super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state =
               (SharedPtrStateBase *)0x0;
        }
      }
      (this->m_ret).super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
      m_ptr = (Expr<float> *)
              local_b8.
              super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
              ._M_impl.super__Vector_impl_data._M_start;
      (this->m_ret).super_ExprPBase<float>.super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.
      m_state = (SharedPtrStateBase *)
                local_b8.
                super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if ((SharedPtrStateBase *)
          local_b8.
          super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
          ._M_impl.super__Vector_impl_data._M_finish != (SharedPtrStateBase *)0x0) {
        LOCK();
        *(deInt32 *)
         ((long)local_b8.
                super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                ._M_impl.super__Vector_impl_data._M_finish + 8) =
             *(deInt32 *)
              ((long)local_b8.
                     super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                     ._M_impl.super__Vector_impl_data._M_finish + 8) + 1;
        UNLOCK();
        LOCK();
        pdVar1 = &((this->m_ret).super_ExprPBase<float>.
                   super_SharedPtr<const_vkt::shaderexecutor::Expr<float>_>.m_state)->weakRefCount;
        *pdVar1 = *pdVar1 + 1;
        UNLOCK();
      }
    }
    if ((SharedPtrStateBase *)
        local_b8.
        super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
        ._M_impl.super__Vector_impl_data._M_finish != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = (deInt32 *)
               ((long)local_b8.
                      super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                      ._M_impl.super__Vector_impl_data._M_finish + 8);
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        local_b8.
        super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (*(*(_func_int ***)
            &(local_b8.
              super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
              ._M_impl.super__Vector_impl_data._M_finish)->
             super_SharedPtr<const_vkt::shaderexecutor::Statement>)[2])();
      }
      LOCK();
      pdVar1 = (deInt32 *)
               ((long)local_b8.
                      super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                      ._M_impl.super__Vector_impl_data._M_finish + 0xc);
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        if ((SharedPtrStateBase *)
            local_b8.
            super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
            ._M_impl.super__Vector_impl_data._M_finish != (SharedPtrStateBase *)0x0) {
          (*(*(_func_int ***)
              &(local_b8.
                super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
                ._M_impl.super__Vector_impl_data._M_finish)->
               super_SharedPtr<const_vkt::shaderexecutor::Statement>)[1])();
        }
        local_b8.
        super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      }
    }
    std::vector<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>::
    vector(&local_a0,&local_38);
    local_b8.
    super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (this->m_body).
         super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_b8.
    super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (this->m_body).
         super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_b8.
    super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (this->m_body).
         super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->m_body).
    super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_a0.
         super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (this->m_body).
    super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_a0.
         super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    (this->m_body).
    super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_a0.
         super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_a0.
    super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_a0.
    super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a0.
    super__Vector_base<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>::
    ~vector(&local_b8);
    std::vector<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>::
    ~vector(&local_a0);
    Tuple4<vkt::shaderexecutor::ExprP<float>,_vkt::shaderexecutor::ExprP<float>,_vkt::shaderexecutor::ExprP<vkt::shaderexecutor::Void>,_vkt::shaderexecutor::ExprP<vkt::shaderexecutor::Void>_>
    ::~Tuple4(&local_88);
    std::vector<vkt::shaderexecutor::StatementP,_std::allocator<vkt::shaderexecutor::StatementP>_>::
    ~vector(&local_38);
  }
  return;
}

Assistant:

const Void&			operator[]		(int)	const	{ return *this; }